

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O3

bool anon_unknown.dwarf_224fb3::checkPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int lx,int rx,int ly,int ry,int width)

{
  float *pfVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  bool bVar6;
  half *phVar7;
  uint uVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  
  bVar6 = true;
  if (ly <= ry) {
    lVar14 = (long)ly;
    lVar13 = lVar14 * 2;
    iVar3 = ly * width;
    phVar7 = ph->_data + ph->_sizeY * lVar14;
    bVar6 = false;
    do {
      lVar12 = (long)lx;
      if (lx <= rx) {
        do {
          iVar11 = (iVar3 + (int)lVar12) % 0x801;
          fVar15 = (float)iVar11;
          fVar9 = ABS(fVar15);
          uVar8 = (uint)fVar15 >> 0x10 & 0x8000;
          if ((uint)fVar9 < 0x38800000) {
            if ((0x33000000 < (uint)fVar9) &&
               (uVar10 = (uint)fVar9 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar9 >> 0x17),
               uVar8 = uVar8 | uVar10 >> (0x7eU - cVar2 & 0x1f),
               0x80000000 < uVar10 << (cVar2 + 0xa2U & 0x1f))) {
              uVar8 = uVar8 + 1;
            }
          }
          else if ((uint)fVar9 < 0x7f800000) {
            if ((uint)fVar9 < 0x477ff000) {
              uVar8 = (int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd | uVar8;
            }
            else {
              uVar8 = uVar8 | 0x7c00;
            }
          }
          else {
            uVar8 = uVar8 | 0x7c00;
            if (fVar9 != INFINITY) {
              uVar10 = (uint)fVar9 >> 0xd & 0x3ff;
              uVar8 = uVar8 | uVar10 | (uint)(uVar10 == 0);
            }
          }
          fVar9 = *(float *)(_imath_half_to_float_table + (ulong)phVar7[lVar12]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(uVar8 & 0xffff) * 4);
          if ((fVar9 != *pfVar1) || (NAN(fVar9) || NAN(*pfVar1))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            poVar4 = (ostream *)
                     ::operator<<(poVar4,(half)*(uint16_t *)
                                                ((long)&ph->_data[lVar12]._h + lVar13 * ph->_sizeY))
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
            plVar5 = (long *)std::ostream::operator<<(poVar4,iVar11);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
            std::ostream::flush();
            return bVar6;
          }
          lVar12 = lVar12 + 1;
        } while (rx + 1 != (int)lVar12);
      }
      lVar12 = lVar14 + 1;
      bVar6 = ry <= lVar14;
      lVar13 = lVar13 + 2;
      iVar3 = iVar3 + width;
      phVar7 = phVar7 + ph->_sizeY;
      lVar14 = lVar12;
    } while (ry + 1 != (int)lVar12);
  }
  return bVar6;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
    return true;
}